

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O2

QFlags<Qt::AlignmentFlag>
QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>(QVariant *data)

{
  int iVar1;
  int iVar2;
  QFlags<Qt::AlignmentFlag> QVar3;
  
  iVar1 = ::QVariant::typeId(data);
  iVar2 = qMetaTypeId<QFlags<Qt::AlignmentFlag>>();
  if (iVar1 == iVar2) {
    QVar3 = qvariant_cast<QFlags<Qt::AlignmentFlag>>(data);
    return (QFlags<Qt::AlignmentFlag>)
           QVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  QVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)::QVariant::toInt((bool *)data);
  return (QFlags<Qt::AlignmentFlag>)
         QVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
}

Assistant:

T legacyFlagValueFromModelData(const QVariant &data)
{
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<typename T::enum_type>, int> ||
               std::is_same_v<std::underlying_type_t<typename T::enum_type>, uint>) {
        return T::fromInt(data.toInt());
    }

    return T();
}